

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O0

FunctionResult * __thiscall
wasm::ExecutionResults::run
          (FunctionResult *__return_storage_ptr__,ExecutionResults *this,Function *func,Module *wasm
          ,ModuleRunner *instance)

{
  size_t *this_00;
  bool bVar1;
  byte bVar2;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar3;
  TrapException *anon_var_0;
  WasmException *e;
  HostLimitException *anon_var_0_1;
  Literals local_110;
  undefined8 local_d8;
  Literal local_d0;
  undefined4 local_b8;
  Trap local_b1;
  undefined8 *local_b0;
  Type *param;
  Iterator __end2;
  Iterator __begin2;
  Type *__range2;
  undefined1 local_68 [8];
  Literals arguments;
  ModuleRunner *instance_local;
  Module *wasm_local;
  Function *func_local;
  ExecutionResults *this_local;
  
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)instance;
  Literals::Literals((Literals *)local_68);
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       (size_t)Function::getParams(func);
  this_00 = &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  join_0x00000010_0x00000000_ =
       (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::begin((Type *)this_00);
  PVar3 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::end((Type *)this_00);
  do {
    __end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)PVar3.index;
    param = PVar3.parent;
    bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                      ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                       &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                        index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                              &param);
    if (!bVar1) {
      ModuleRunnerBase<wasm::ModuleRunner>::callFunction
                (&local_110,
                 (ModuleRunnerBase<wasm::ModuleRunner> *)
                 arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 (Name)(func->super_Importable).super_Named.name.super_IString.str,
                 (Literals *)local_68);
      std::variant<wasm::Literals,wasm::ExecutionResults::Trap,wasm::ExecutionResults::Exception>::
      variant<wasm::Literals,void,void,wasm::Literals,void>
                ((variant<wasm::Literals,wasm::ExecutionResults::Trap,wasm::ExecutionResults::Exception>
                  *)__return_storage_ptr__,&local_110);
      Literals::~Literals(&local_110);
LAB_002ca26a:
      local_b8 = 1;
      Literals::~Literals((Literals *)local_68);
      return __return_storage_ptr__;
    }
    local_b0 = (undefined8 *)
               ::wasm::Type::Iterator::operator*
                         ((Iterator *)
                          &__end2.
                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                         );
    bVar2 = ::wasm::Type::isDefaultable();
    if ((bVar2 & 1) == 0) {
      std::operator<<((ostream *)&std::cout,
                      "[trap fuzzer can only send defaultable parameters to exports]\n");
      std::variant<wasm::Literals,wasm::ExecutionResults::Trap,wasm::ExecutionResults::Exception>::
      variant<wasm::ExecutionResults::Trap,void,void,wasm::ExecutionResults::Trap,void>
                ((variant<wasm::Literals,wasm::ExecutionResults::Trap,wasm::ExecutionResults::Exception>
                  *)__return_storage_ptr__,&local_b1);
      goto LAB_002ca26a;
    }
    local_d8 = *local_b0;
    ::wasm::Literal::makeZero((Type)&local_d0);
    SmallVector<wasm::Literal,_1UL>::push_back
              ((SmallVector<wasm::Literal,_1UL> *)local_68,&local_d0);
    ::wasm::Literal::~Literal(&local_d0);
    ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
              ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
               &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
    PVar3.index = (size_t)__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                          .parent;
    PVar3.parent = param;
  } while( true );
}

Assistant:

FunctionResult run(Function* func, Module& wasm, ModuleRunner& instance) {
    try {
      // call the method
      Literals arguments;
      for (const auto& param : func->getParams()) {
        // zeros in arguments TODO: more?
        if (!param.isDefaultable()) {
          std::cout << "[trap fuzzer can only send defaultable parameters to "
                       "exports]\n";
          return Trap{};
        }
        arguments.push_back(Literal::makeZero(param));
      }
      return instance.callFunction(func->name, arguments);
    } catch (const TrapException&) {
      return Trap{};
    } catch (const WasmException& e) {
      std::cout << "[exception thrown: " << e << "]" << std::endl;
      return Exception{};
    } catch (const HostLimitException&) {
      // This should be ignored and not compared with, as optimizations can
      // change whether a host limit is reached.
      ignore = true;
      return {};
    }
  }